

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS
ref_node_tri_dquality_dnode0(REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality,REF_DBL *d_quality)

{
  int iVar1;
  double dVar2;
  uint uVar3;
  REF_DBL *pRVar4;
  REF_DBL *pRVar5;
  long lVar6;
  undefined8 uVar7;
  long lVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  REF_DBL det;
  REF_DBL area;
  REF_DBL l2;
  REF_DBL jac [9];
  REF_DBL e2 [3];
  REF_DBL e1 [3];
  REF_DBL e0 [3];
  REF_DBL d_area [3];
  REF_DBL dxyz0 [3] [3];
  REF_DBL d_area_in_metric [3];
  REF_DBL da [3];
  REF_DBL l1;
  REF_DBL l0;
  REF_DBL d_l1 [3];
  REF_DBL d_l0 [3];
  REF_DBL d_denom [3];
  double local_3a8 [4];
  double local_388;
  undefined8 uStack_380;
  double local_378;
  undefined8 uStack_370;
  double local_368 [4];
  double local_348 [4];
  REF_DBL local_328 [3];
  double local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  double local_2d8;
  undefined8 uStack_2d0;
  double local_2c8 [4];
  double local_2a8 [4];
  double local_288 [4];
  double local_268;
  undefined8 uStack_260;
  REF_DBL local_258 [3];
  double adStack_240 [7];
  REF_DBL local_208 [3];
  double local_1f0 [7];
  double adStack_1b8 [14];
  double adStack_148 [4];
  double local_128 [6];
  double local_f8 [6];
  REF_DBL local_c8 [6];
  REF_DBL local_98 [6];
  double adStack_68 [7];
  
  if (ref_node->tri_quality == 2) {
    iVar1 = *nodes;
    pRVar4 = ref_node->real;
    lVar6 = 0;
    do {
      adStack_68[lVar6] = pRVar4[iVar1 * 0xf + 9 + (int)lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    iVar1 = nodes[1];
    lVar6 = 0;
    do {
      local_98[lVar6] = pRVar4[iVar1 * 0xf + 9 + (int)lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    iVar1 = nodes[2];
    lVar6 = 0;
    do {
      local_c8[lVar6] = pRVar4[iVar1 * 0xf + 9 + (int)lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    lVar6 = 0;
    do {
      local_f8[lVar6] = (adStack_68[lVar6] + local_98[lVar6] + local_c8[lVar6]) / 3.0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    uVar3 = ref_matrix_exp_m(local_f8,local_128);
    if (uVar3 == 0) {
      uVar3 = ref_matrix_jacob_m(local_128,local_328);
      if (uVar3 == 0) {
        uVar3 = ref_matrix_vect_mult(local_328,ref_node->real + (long)*nodes * 0xf,local_348);
        if (uVar3 == 0) {
          uVar3 = ref_matrix_vect_mult(local_328,ref_node->real + (long)nodes[1] * 0xf,local_3a8);
          if (uVar3 == 0) {
            uVar3 = ref_matrix_vect_mult(local_328,ref_node->real + (long)nodes[2] * 0xf,local_368);
            if (uVar3 == 0) {
              local_208[0] = local_328[0];
              local_208[1] = local_328[1];
              local_208[2] = local_328[2];
              local_1f0[0] = local_310;
              local_1f0[1] = (double)uStack_308;
              local_1f0[2] = (double)local_300;
              local_1f0[3] = (double)uStack_2f8;
              local_1f0[4] = (double)local_2f0;
              local_1f0[5] = (double)uStack_2e8;
              lVar6 = 0;
              do {
                local_288[lVar6] = local_368[lVar6] - local_3a8[lVar6];
                lVar6 = lVar6 + 1;
              } while (lVar6 != 3);
              lVar6 = 0;
              do {
                local_2a8[lVar6] = local_348[lVar6] - local_368[lVar6];
                lVar6 = lVar6 + 1;
              } while (lVar6 != 3);
              lVar6 = 0;
              do {
                local_2c8[lVar6] = local_3a8[lVar6] - local_348[lVar6];
                lVar6 = lVar6 + 1;
              } while (lVar6 != 3);
              pRVar4 = local_258;
              pRVar5 = local_208;
              lVar6 = 0;
              do {
                lVar8 = 0;
                do {
                  pRVar4[lVar8] = -pRVar5[lVar8];
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 3);
                lVar6 = lVar6 + 1;
                pRVar4 = pRVar4 + 3;
                pRVar5 = pRVar5 + 3;
              } while (lVar6 != 3);
              local_388 = local_2c8[2];
              uStack_380 = 0;
              lVar6 = -0x18;
              do {
                dVar14 = *(double *)((long)adStack_240 + lVar6);
                dVar13 = *(double *)((long)adStack_240 + lVar6 + 0x18);
                dVar12 = *(double *)((long)adStack_240 + lVar6 + 0x30);
                *(double *)((long)adStack_1b8 + lVar6 + 0x18) =
                     dVar13 * local_288[2] - local_288[1] * dVar12;
                *(double *)((long)adStack_1b8 + lVar6 + 0x30) =
                     dVar12 * local_288[0] - local_288[2] * dVar14;
                *(double *)((long)adStack_1b8 + lVar6 + 0x48) =
                     dVar14 * local_288[1] - local_288[0] * dVar13;
                lVar6 = lVar6 + 8;
              } while (lVar6 != 0);
              local_268 = local_2c8[0] * local_2c8[0] + local_2c8[1] * local_2c8[1];
              uStack_260 = 0;
              lVar6 = 0;
              do {
                adStack_1b8[lVar6 + 10] =
                     adStack_240[lVar6 + 3] * (local_2c8[2] + local_2c8[2]) +
                     adStack_240[lVar6] * (local_2c8[1] + local_2c8[1]) +
                     local_258[lVar6] * (local_2c8[0] + local_2c8[0]) +
                     local_1f0[lVar6 + 3] * (local_2a8[2] + local_2a8[2]) +
                     local_208[lVar6] * (local_2a8[0] + local_2a8[0]) +
                     local_1f0[lVar6] * (local_2a8[1] + local_2a8[1]);
                lVar6 = lVar6 + 1;
              } while (lVar6 != 3);
              local_378 = local_2c8[2] * local_288[0] + -local_2c8[0] * local_288[2];
              dVar15 = local_2c8[1] * local_288[2] + -local_2c8[2] * local_288[1];
              dVar12 = local_2c8[0] * local_288[1] + -local_2c8[1] * local_288[0];
              local_2d8 = dVar12 * dVar12 + dVar15 * dVar15 + local_378 * local_378;
              dVar14 = SQRT(local_2d8);
              uStack_2d0 = 0;
              uStack_370 = uStack_380;
              dVar13 = dVar14;
              if (local_2d8 < 0.0) {
                uStack_370 = 0;
                dVar13 = sqrt(local_2d8);
              }
              dVar16 = local_378 + local_378;
              lVar6 = 0;
              dVar11 = local_2d8;
              local_378 = dVar16;
              do {
                dVar2 = dVar14;
                if (dVar11 < 0.0) {
                  dVar2 = sqrt(dVar11);
                  dVar11 = local_2d8;
                  dVar16 = local_378;
                }
                adStack_148[lVar6] =
                     (adStack_1b8[lVar6 + 6] * (dVar12 + dVar12) +
                     adStack_1b8[lVar6] * (dVar15 + dVar15) + adStack_1b8[lVar6 + 3] * dVar16) *
                     (0.25 / dVar2);
                lVar6 = lVar6 + 1;
              } while (lVar6 != 3);
              dVar12 = local_288[2] * local_288[2] +
                       local_288[0] * local_288[0] + local_288[1] * local_288[1] +
                       local_2a8[2] * local_2a8[2] +
                       local_2a8[0] * local_2a8[0] + local_2a8[1] * local_2a8[1] +
                       local_388 * local_388 + local_268;
              dVar13 = dVar13 * 0.5;
              dVar14 = dVar12 * 1e+20;
              if (dVar14 <= -dVar14) {
                dVar14 = -dVar14;
              }
              dVar11 = -dVar13;
              dVar15 = dVar13;
              if (dVar13 <= dVar11) {
                dVar15 = dVar11;
              }
              if (dVar14 <= dVar15) {
                *quality = -1.0;
                uVar3 = 0;
              }
              else {
                *quality = (dVar13 / dVar12) * 6.928203230275509;
                uVar3 = 0;
                lVar6 = 0;
                do {
                  d_quality[lVar6] =
                       (((adStack_148[lVar6] * dVar12 + adStack_1b8[lVar6 + 10] * dVar11) *
                        6.928203230275509) / dVar12) / dVar12;
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 3);
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x85f,"ref_node_tri_jac_dquality_dnode0",(ulong)uVar3,"xyz2");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x85d,"ref_node_tri_jac_dquality_dnode0",(ulong)uVar3,"xyz1");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x85b,"ref_node_tri_jac_dquality_dnode0",(ulong)uVar3,"xyz0");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x858,"ref_node_tri_jac_dquality_dnode0",(ulong)uVar3,"jac");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x857,
             "ref_node_tri_jac_dquality_dnode0",(ulong)uVar3,"exp");
    }
    if (uVar3 == 0) {
      return 0;
    }
    uVar7 = 0x8a3;
  }
  else {
    if (ref_node->tri_quality != 1) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x8a6,
             "ref_node_tri_dquality_dnode0","case not recognized");
      return 1;
    }
    uVar3 = ref_node_dratio_dnode0(ref_node,*nodes,nodes[1],local_f8,local_98);
    if (uVar3 == 0) {
      uVar3 = ref_node_dratio_dnode0(ref_node,*nodes,nodes[2],local_128,local_c8);
      if (uVar3 == 0) {
        uVar3 = ref_node_ratio(ref_node,nodes[1],nodes[2],local_348);
        if (uVar3 == 0) {
          uVar3 = ref_node_tri_darea_dnode0(ref_node,nodes,local_368,local_258);
          if (uVar3 == 0) {
            iVar1 = *nodes;
            pRVar4 = ref_node->real;
            lVar6 = 0;
            do {
              local_328[lVar6] = pRVar4[iVar1 * 0xf + 3 + (int)lVar6];
              lVar6 = lVar6 + 1;
            } while (lVar6 != 6);
            uVar3 = ref_matrix_det_m(local_328,local_3a8);
            dVar14 = local_3a8[0];
            if (uVar3 == 0) {
              iVar1 = nodes[1];
              pRVar4 = ref_node->real;
              lVar6 = 0;
              do {
                local_328[lVar6] = pRVar4[iVar1 * 0xf + 3 + (int)lVar6];
                lVar6 = lVar6 + 1;
              } while (lVar6 != 6);
              uVar3 = ref_matrix_det_m(local_328,local_3a8);
              dVar13 = local_3a8[0];
              if (uVar3 == 0) {
                iVar1 = nodes[2];
                pRVar4 = ref_node->real;
                lVar6 = 0;
                do {
                  local_328[lVar6] = pRVar4[iVar1 * 0xf + 3 + (int)lVar6];
                  lVar6 = lVar6 + 1;
                } while (lVar6 != 6);
                uVar3 = ref_matrix_det_m(local_328,local_3a8);
                if (uVar3 == 0) {
                  uVar9 = SUB84(dVar14,0);
                  uVar10 = (undefined4)((ulong)dVar14 >> 0x20);
                  if (dVar13 <= dVar14) {
                    uVar9 = SUB84(dVar13,0);
                    uVar10 = (undefined4)((ulong)dVar13 >> 0x20);
                  }
                  if (local_3a8[0] <= (double)CONCAT44(uVar10,uVar9)) {
                    uVar9 = SUB84(local_3a8[0],0);
                    uVar10 = (undefined4)((ulong)local_3a8[0] >> 0x20);
                  }
                  dVar14 = pow((double)CONCAT44(uVar10,uVar9),0.3333333333333333);
                  lVar6 = 0;
                  do {
                    dVar13 = pow((double)CONCAT44(uVar10,uVar9),0.3333333333333333);
                    adStack_1b8[lVar6] = dVar13 * local_258[lVar6];
                    lVar6 = lVar6 + 1;
                  } while (lVar6 != 3);
                  lVar6 = 0;
                  do {
                    adStack_68[lVar6] =
                         local_98[lVar6] * (local_f8[0] + local_f8[0]) +
                         local_c8[lVar6] * (local_128[0] + local_128[0]);
                    lVar6 = lVar6 + 1;
                  } while (lVar6 != 3);
                  dVar14 = dVar14 * local_368[0];
                  dVar13 = local_348[0] * local_348[0] +
                           local_f8[0] * local_f8[0] + local_128[0] * local_128[0];
                  dVar12 = dVar13 * 1e+20;
                  if (dVar12 <= -dVar12) {
                    dVar12 = -dVar12;
                  }
                  dVar11 = -dVar14;
                  dVar15 = dVar14;
                  if (dVar14 <= dVar11) {
                    dVar15 = dVar11;
                  }
                  if (dVar12 <= dVar15) {
                    *quality = -1.0;
                    *d_quality = 0.0;
                    d_quality[1] = 0.0;
                    d_quality[2] = 0.0;
                    uVar3 = 0;
                  }
                  else {
                    *quality = (dVar14 * 6.9282032302755105) / dVar13;
                    uVar3 = 0;
                    lVar6 = 0;
                    do {
                      d_quality[lVar6] =
                           (((adStack_1b8[lVar6] * dVar13 + adStack_68[lVar6] * dVar11) *
                            6.9282032302755105) / dVar13) / dVar13;
                      lVar6 = lVar6 + 1;
                    } while (lVar6 != 3);
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                         ,0x82b,"ref_node_tri_epic_dquality_dnode0",(ulong)uVar3,"n2");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x827,"ref_node_tri_epic_dquality_dnode0",(ulong)uVar3,"n1");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x823,"ref_node_tri_epic_dquality_dnode0",(ulong)uVar3,"n0");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x820,"ref_node_tri_epic_dquality_dnode0",(ulong)uVar3,"area");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x81e,"ref_node_tri_epic_dquality_dnode0",(ulong)uVar3,"l2");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x81d,"ref_node_tri_epic_dquality_dnode0",(ulong)uVar3,"l1");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x81c,
             "ref_node_tri_epic_dquality_dnode0",(ulong)uVar3,"l0");
    }
    if (uVar3 == 0) {
      return 0;
    }
    uVar7 = 0x89f;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar7,
         "ref_node_tri_dquality_dnode0",(ulong)uVar3,"epic");
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_node_tri_dquality_dnode0(REF_NODE ref_node,
                                                REF_INT *nodes,
                                                REF_DBL *quality,
                                                REF_DBL *d_quality) {
  switch (ref_node->tri_quality) {
    case REF_NODE_EPIC_QUALITY:
      RSS(ref_node_tri_epic_dquality_dnode0(ref_node, nodes, quality,
                                            d_quality),
          "epic");
      break;
    case REF_NODE_JAC_QUALITY:
      RSS(ref_node_tri_jac_dquality_dnode0(ref_node, nodes, quality, d_quality),
          "epic");
      break;
    default:
      THROW("case not recognized");
  }
  return REF_SUCCESS;
}